

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O0

reference __thiscall
jsoncons::jmespath::
eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::string_type_name(eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                   *this)

{
  int iVar1;
  string_type *in_RDI;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *unaff_retaddr;
  char *in_stack_00000008;
  string local_28 [32];
  
  if (eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::string_type_name()::string_type_name == '\0') {
    iVar1 = __cxa_guard_acquire(&eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::string_type_name()::string_type_name);
    if (iVar1 != 0) {
      string_constant_of_type<char>(in_stack_00000008,(wchar_t *)unaff_retaddr);
      basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                (unaff_retaddr,in_RDI);
      std::__cxx11::string::~string(local_28);
      __cxa_atexit(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                   ~basic_json,&string_type_name::string_type_name,&__dso_handle);
      __cxa_guard_release(&eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::string_type_name()::string_type_name);
    }
  }
  return &string_type_name::string_type_name;
}

Assistant:

reference string_type_name()
        {
            static Json string_type_name(JSONCONS_STRING_CONSTANT(char_type, "string"));

            return string_type_name;
        }